

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.hh
# Opt level: O0

void __thiscall QPDFObjectHandle::QPDFDictItems::iterator::~iterator(iterator *this)

{
  iterator *this_local;
  
  ~iterator(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual ~iterator() = default;